

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O0

int nva_rstype(char *name)

{
  int iVar1;
  char *name_local;
  
  iVar1 = strcmp(name,"bar0");
  if (iVar1 == 0) {
    name_local._4_4_ = 0;
  }
  else {
    iVar1 = strcmp(name,"mmio");
    if (iVar1 == 0) {
      name_local._4_4_ = 0;
    }
    else {
      iVar1 = strcmp(name,"bar1");
      if (iVar1 == 0) {
        name_local._4_4_ = 1;
      }
      else {
        iVar1 = strcmp(name,"fb");
        if (iVar1 == 0) {
          name_local._4_4_ = 1;
        }
        else {
          iVar1 = strcmp(name,"bar2");
          if (iVar1 == 0) {
            name_local._4_4_ = 2;
          }
          else {
            iVar1 = strcmp(name,"bar3");
            if (iVar1 == 0) {
              name_local._4_4_ = 2;
            }
            else {
              iVar1 = strcmp(name,"ramin");
              if (iVar1 == 0) {
                name_local._4_4_ = 2;
              }
              else {
                iVar1 = strcmp(name,"iobar");
                if (iVar1 == 0) {
                  name_local._4_4_ = 3;
                }
                else {
                  iVar1 = strcmp(name,"rawmem");
                  if (iVar1 == 0) {
                    name_local._4_4_ = 4;
                  }
                  else {
                    iVar1 = strcmp(name,"rawio");
                    if (iVar1 == 0) {
                      name_local._4_4_ = 5;
                    }
                    else {
                      iVar1 = strcmp(name,"pdac");
                      if (iVar1 == 0) {
                        name_local._4_4_ = 6;
                      }
                      else {
                        iVar1 = strcmp(name,"eeprom");
                        if (iVar1 == 0) {
                          name_local._4_4_ = 7;
                        }
                        else {
                          iVar1 = strcmp(name,"cr");
                          if (iVar1 == 0) {
                            name_local._4_4_ = 8;
                          }
                          else {
                            iVar1 = strcmp(name,"sr");
                            if (iVar1 == 0) {
                              name_local._4_4_ = 9;
                            }
                            else {
                              iVar1 = strcmp(name,"gr");
                              if (iVar1 == 0) {
                                name_local._4_4_ = 0xb;
                              }
                              else {
                                iVar1 = strcmp(name,"ar");
                                if (iVar1 == 0) {
                                  name_local._4_4_ = 10;
                                }
                                else {
                                  iVar1 = strcmp(name,"cr");
                                  if (iVar1 == 0) {
                                    name_local._4_4_ = 8;
                                  }
                                  else {
                                    iVar1 = strcmp(name,"vst");
                                    if (iVar1 == 0) {
                                      name_local._4_4_ = 0xc;
                                    }
                                    else {
                                      iVar1 = strcmp(name,"dpram");
                                      if (iVar1 == 0) {
                                        name_local._4_4_ = 0xd;
                                      }
                                      else {
                                        iVar1 = strcmp(name,"pipe");
                                        if (iVar1 == 0) {
                                          name_local._4_4_ = 0xe;
                                        }
                                        else {
                                          iVar1 = strcmp(name,"rdi");
                                          if (iVar1 == 0) {
                                            name_local._4_4_ = 0xf;
                                          }
                                          else {
                                            iVar1 = strcmp(name,"rdib");
                                            if (iVar1 == 0) {
                                              name_local._4_4_ = 0x10;
                                            }
                                            else {
                                              iVar1 = strcmp(name,"vcomp_code");
                                              if (iVar1 == 0) {
                                                name_local._4_4_ = 0x11;
                                              }
                                              else {
                                                iVar1 = strcmp(name,"vcomp_reg");
                                                if (iVar1 == 0) {
                                                  name_local._4_4_ = 0x12;
                                                }
                                                else {
                                                  iVar1 = strcmp(name,"macro_code");
                                                  if (iVar1 == 0) {
                                                    name_local._4_4_ = 0x13;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(name,"xt");
                                                    if (iVar1 == 0) {
                                                      name_local._4_4_ = 0x14;
                                                    }
                                                    else {
                                                      name_local._4_4_ = 0x15;
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

int nva_rstype(const char *name) {
	if (!strcmp(name, "bar0"))
		return NVA_REGSPACE_BAR0;
	if (!strcmp(name, "mmio"))
		return NVA_REGSPACE_BAR0;
	if (!strcmp(name, "bar1"))
		return NVA_REGSPACE_BAR1;
	if (!strcmp(name, "fb"))
		return NVA_REGSPACE_BAR1;
	if (!strcmp(name, "bar2"))
		return NVA_REGSPACE_BAR2;
	if (!strcmp(name, "bar3"))
		return NVA_REGSPACE_BAR2;
	if (!strcmp(name, "ramin"))
		return NVA_REGSPACE_BAR2;
	if (!strcmp(name, "iobar"))
		return NVA_REGSPACE_IOBAR;
	if (!strcmp(name, "rawmem"))
		return NVA_REGSPACE_RAWMEM;
	if (!strcmp(name, "rawio"))
		return NVA_REGSPACE_RAWIO;
	if (!strcmp(name, "pdac"))
		return NVA_REGSPACE_PDAC;
	if (!strcmp(name, "eeprom"))
		return NVA_REGSPACE_EEPROM;
	if (!strcmp(name, "cr"))
		return NVA_REGSPACE_VGA_CR;
	if (!strcmp(name, "sr"))
		return NVA_REGSPACE_VGA_SR;
	if (!strcmp(name, "gr"))
		return NVA_REGSPACE_VGA_GR;
	if (!strcmp(name, "ar"))
		return NVA_REGSPACE_VGA_AR;
	if (!strcmp(name, "cr"))
		return NVA_REGSPACE_VGA_CR;
	if (!strcmp(name, "vst"))
		return NVA_REGSPACE_VGA_ST;
	if (!strcmp(name, "dpram"))
		return NVA_REGSPACE_DPRAM;
	if (!strcmp(name, "pipe"))
		return NVA_REGSPACE_PIPE;
	if (!strcmp(name, "rdi"))
		return NVA_REGSPACE_RDI;
	if (!strcmp(name, "rdib"))
		return NVA_REGSPACE_RDIB;
	if (!strcmp(name, "vcomp_code"))
		return NVA_REGSPACE_VCOMP_CODE;
	if (!strcmp(name, "vcomp_reg"))
		return NVA_REGSPACE_VCOMP_REG;
	if (!strcmp(name, "macro_code"))
		return NVA_REGSPACE_MACRO_CODE;
	if (!strcmp(name, "xt"))
		return NVA_REGSPACE_XT;
	return NVA_REGSPACE_UNKNOWN;
}